

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O3

void If_CutSort(If_Man_t *p,If_Set_t *pCutSet,If_Cut_t *pCut)

{
  If_Par_t *pIVar1;
  If_Cut_t *pC0;
  int iVar2;
  If_Cut_t **ppIVar3;
  short sVar4;
  ulong uVar5;
  
  ppIVar3 = pCutSet->ppCuts;
  uVar5 = (ulong)pCutSet->nCuts;
  if (ppIVar3[uVar5] == pCut) {
    do {
      if (pCutSet->nCutsMax < (short)uVar5) {
        __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                      ,0x2e9,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
      }
      if ((short)uVar5 == 0) {
        sVar4 = 1;
        goto LAB_008cca88;
      }
      if (((pCut->field_0x1d & 0x40) != 0) ||
         ((((((pIVar1 = p->pPars, pIVar1->fUseDsd == 0 &&
              (pIVar1->pFuncCell2 ==
               (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) &&
             (pIVar1->fUseBat == 0)) &&
            (((pIVar1->pLutStruct == (char *)0x0 && (pIVar1->fUserRecLib == 0)) &&
             ((pIVar1->fUserSesLib == 0 &&
              ((pIVar1->fEnableCheck07 == 0 && (pIVar1->fUseCofVars == 0)))))))) &&
           (pIVar1->fUseAndVars == 0)) &&
          ((((pIVar1->fUse34Spec == 0 && (pIVar1->fUseDsdTune == 0)) &&
            (pIVar1->fEnableCheck75 == 0)) && (pIVar1->fEnableCheck75u == 0)))))) {
LAB_008cc9f2:
        sVar4 = (short)uVar5;
        if (sVar4 < 1) goto LAB_008cca81;
        iVar2 = If_ManSortCompare(p,pCutSet->ppCuts[(uVar5 & 0xffff) - 1],pCut);
        if (iVar2 < 1) goto LAB_008cca7d;
        uVar5 = (ulong)(uint)((int)(uVar5 & 0xffff) << 3);
        goto LAB_008cca1b;
      }
      pC0 = *ppIVar3;
      if ((pC0->field_0x1d & 0x40) == 0) {
        iVar2 = If_ManSortCompare(p,pC0,pCut);
        uVar5 = (ulong)(ushort)pCutSet->nCuts;
        if (iVar2 != 1) goto LAB_008cc9f2;
        ppIVar3 = pCutSet->ppCuts;
      }
      *ppIVar3 = pCut;
      pCutSet->ppCuts[(short)uVar5] = pC0;
      ppIVar3 = pCutSet->ppCuts;
      pCut = pC0;
    } while (ppIVar3[(short)uVar5] == pC0);
  }
  __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifCut.c"
                ,0x2e8,"void If_CutSort(If_Man_t *, If_Set_t *, If_Cut_t *)");
  while( true ) {
    *(undefined8 *)((long)ppIVar3 + uVar5) = *(undefined8 *)((long)ppIVar3 + (uVar5 - 8));
    *(If_Cut_t **)((long)pCutSet->ppCuts + (uVar5 - 8)) = pCut;
    iVar2 = If_ManSortCompare(p,*(If_Cut_t **)((long)pCutSet->ppCuts + (uVar5 - 0x10)),pCut);
    uVar5 = uVar5 - 8;
    if (iVar2 < 1) break;
LAB_008cca1b:
    ppIVar3 = pCutSet->ppCuts;
    if (uVar5 == 8) {
      if ((((*ppIVar3)->field_0x1d & 0x40) != 0) || ((pCut->field_0x1d & 0x40) == 0)) {
        ppIVar3[1] = *ppIVar3;
        *pCutSet->ppCuts = pCut;
      }
      break;
    }
  }
LAB_008cca7d:
  sVar4 = pCutSet->nCuts;
LAB_008cca81:
  if (sVar4 < pCutSet->nCutsMax) {
    sVar4 = sVar4 + 1;
LAB_008cca88:
    pCutSet->nCuts = sVar4;
  }
  return;
}

Assistant:

void If_CutSort( If_Man_t * p, If_Set_t * pCutSet, If_Cut_t * pCut )
{
//    int Counter = 0;
    int i;

    // the new cut is the last one
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    assert( pCutSet->nCuts <= pCutSet->nCutsMax );

    // cut structure is empty
    if ( pCutSet->nCuts == 0 )
    {
        pCutSet->nCuts++;
        return;
    }

    if ( !pCut->fUseless && 
         (p->pPars->fUseDsd || p->pPars->pFuncCell2 || p->pPars->fUseBat || 
          p->pPars->pLutStruct || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
          p->pPars->fEnableCheck07 || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || 
          p->pPars->fUseDsdTune || p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) )
    {
        If_Cut_t * pFirst = pCutSet->ppCuts[0];
        if ( pFirst->fUseless || If_ManSortCompare(p, pFirst, pCut) == 1 )
        {
            pCutSet->ppCuts[0] = pCut;
            pCutSet->ppCuts[pCutSet->nCuts] = pFirst;
            If_CutSort( p, pCutSet, pFirst );
            return;
        }
    }

    // the cut will be added - find its place
    for ( i = pCutSet->nCuts-1; i >= 0; i-- )
    {
//        Counter++;
        if ( If_ManSortCompare( p, pCutSet->ppCuts[i], pCut ) <= 0 || (i == 0 && !pCutSet->ppCuts[0]->fUseless && pCut->fUseless) )
            break;
        pCutSet->ppCuts[i+1] = pCutSet->ppCuts[i];
        pCutSet->ppCuts[i] = pCut;
    }
//    Abc_Print( 1, "%d ", Counter );

    // update the number of cuts
    if ( pCutSet->nCuts < pCutSet->nCutsMax )
        pCutSet->nCuts++;
}